

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
               (void)

{
  pointer puVar1;
  Column_settings *pCVar2;
  pointer pvVar3;
  uint local_34c;
  uint *local_348;
  uint *local_340;
  uint local_334;
  undefined1 local_330;
  undefined8 local_328;
  shared_count sStack_320;
  undefined **local_318;
  undefined1 local_310;
  undefined8 *local_308;
  uint **local_300;
  undefined **local_2f8;
  undefined1 local_2f0;
  undefined8 *local_2e8;
  uint **local_2e0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
            (&columns,&m);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x36f);
  local_340 = &local_34c;
  local_34c = (uint)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_348 = &local_334;
  local_334 = 7;
  local_330 = (uint)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 7;
  local_328 = 0;
  sStack_320.pi_ = (sp_counted_base *)0x0;
  local_2e0 = &local_340;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00257d58;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_348;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_00257da8;
  local_308 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_320);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x371);
  local_34c = 6;
  local_330 = m.matrix_.super_RU_pairing_option.barcode_.
              super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].death == 6;
  local_340 = &m.matrix_.super_RU_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_328 = 0;
  sStack_320.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00257d58;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_340;
  local_348 = &local_34c;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_00257da8;
  local_308 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_348;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_320);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
  ::remove_last(&m.matrix_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar1 != (pointer)0x0) {
    pvVar3 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar1,(long)(pvVar3->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    pvVar3 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
            (&columns,&m);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x37c);
  local_34c = (uint)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_330 = (uint)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 6;
  local_334 = 6;
  local_328 = 0;
  sStack_320.pi_ = (sp_counted_base *)0x0;
  local_340 = &local_34c;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00257d58;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_340;
  local_348 = &local_334;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_00257da8;
  local_308 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_348;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_320);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x37f);
  local_34c = 0xffffffff;
  local_330 = m.matrix_.super_RU_pairing_option.barcode_.
              super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].death == 0xffffffff;
  local_340 = &m.matrix_.super_RU_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_328 = 0;
  sStack_320.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00257d58;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_340;
  local_348 = &local_34c;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_00257d58;
  local_308 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_348;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_320);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
  ::reset(&m.matrix_,m.colSettings_);
  pCVar2 = m.colSettings_;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
  }
  operator_delete(pCVar2,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
  ::~RU_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_ru_maximal_simplex_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  columns[5].clear();

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);
  }

  if constexpr (Matrix::Option_list::has_vine_update) {
    m.remove_maximal_cell(6);
  } else {
    m.remove_last();
  }

  columns.pop_back();
  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death,
                      Matrix::template get_null_value<typename Matrix::ID_index>());
  }
}